

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ProceduralBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProceduralBlockSyntax,slang::syntax::SyntaxKind&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,SyntaxKind *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3)

{
  SyntaxKind SVar1;
  Info *pIVar2;
  size_type sVar3;
  pointer ppAVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ProceduralBlockSyntax *pPVar10;
  long lVar11;
  
  pPVar10 = (ProceduralBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ProceduralBlockSyntax *)this->endPtr < pPVar10 + 1) {
    pPVar10 = (ProceduralBlockSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pPVar10 + 1);
  }
  SVar1 = *args;
  TVar6 = args_2->kind;
  uVar7 = args_2->field_0x2;
  NVar8.raw = (args_2->numFlags).raw;
  uVar9 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pPVar10->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar10->super_MemberSyntax).super_SyntaxNode.kind = SVar1;
  SVar1 = (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar1;
  *(undefined4 *)
   &(pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5
  ;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args_1->super_SyntaxListBase).childCount;
  sVar3 = (args_1->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          size_;
  (pPVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args_1->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pPVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pPVar10;
  sVar3 = (pPVar10->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pPVar10->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar11 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar11) = pPVar10;
      lVar11 = lVar11 + 8;
    } while (sVar3 << 3 != lVar11);
  }
  (pPVar10->keyword).kind = TVar6;
  (pPVar10->keyword).field_0x2 = uVar7;
  (pPVar10->keyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pPVar10->keyword).rawLen = uVar9;
  (pPVar10->keyword).info = pIVar2;
  (pPVar10->statement).ptr = args_3;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pPVar10;
  return pPVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }